

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EverCrypt_Hash.c
# Opt level: O1

void EverCrypt_Hash_Incremental_hash
               (Spec_Hash_Definitions_hash_alg a,uint8_t *output,uint8_t *input,uint32_t input_len)

{
  byte bVar1;
  char cVar2;
  longlong lVar3;
  longlong lVar4;
  longlong lVar5;
  longlong lVar6;
  longlong lVar7;
  longlong lVar8;
  longlong lVar9;
  undefined1 totlen [16];
  undefined1 prev [16];
  undefined1 totlen_00 [16];
  undefined1 prev_00 [16];
  _Bool _Var10;
  Lib_IntVector_Intrinsics_vec256 *extraout_RAX;
  undefined4 *puVar11;
  long lVar12;
  uint32_t uVar13;
  undefined8 uVar14;
  uint8_t *d;
  uint uVar15;
  uint32_t *os;
  Lib_IntVector_Intrinsics_vec256 *st;
  Spec_Hash_Definitions_hash_alg a_00;
  undefined7 in_register_00000039;
  Lib_IntVector_Intrinsics_vec256 *palVar16;
  uint64_t *hash;
  byte bVar17;
  undefined4 uVar18;
  undefined4 uVar19;
  undefined4 uVar20;
  undefined4 uVar21;
  undefined4 uVar22;
  undefined4 uVar23;
  undefined4 uVar24;
  undefined4 uVar25;
  undefined4 uVar26;
  undefined4 uVar27;
  undefined4 uVar28;
  undefined4 uVar29;
  undefined8 in_stack_fffffffffffffec0;
  undefined8 in_stack_fffffffffffffec8;
  uint64_t auStack_120 [23];
  uint32_t local_58 [10];
  
  palVar16 = (Lib_IntVector_Intrinsics_vec256 *)CONCAT71(in_register_00000039,a);
  bVar17 = 0;
  switch((ulong)palVar16 & 0xffffffff) {
  case 0:
    local_58[0] = 0xc1059ed8;
    local_58[1] = 0x367cd507;
    local_58[2] = 0x3070dd17;
    local_58[3] = 0xf70e5939;
    local_58[4] = 0xffc00b31;
    local_58[5] = 0x68581511;
    local_58[6] = 0x64f98fa7;
    local_58[7] = 0xbefa4fa4;
    uVar13 = (input_len >> 6) - (uint)(0x3f < input_len && (input_len & 0x3f) == 0);
    uVar15 = input_len + uVar13 * -0x40;
    EverCrypt_Hash_update_multi_256(local_58,input,uVar13);
    Hacl_Hash_SHA2_sha224_update_last
              ((ulong)(uVar13 * 0x40) + (ulong)uVar15,uVar15,input + uVar13 * 0x40,local_58);
    Hacl_Hash_SHA2_sha224_finish(local_58,output);
    return;
  case 1:
    EverCrypt_Hash_Incremental_hash_256(output,input,input_len);
    return;
  case 2:
    Hacl_Hash_SHA2_hash_384(output,input,input_len);
    return;
  case 3:
    Hacl_Hash_SHA2_hash_512(output,input,input_len);
    return;
  case 4:
    Hacl_Hash_SHA1_hash_oneshot(output,input,input_len);
    return;
  case 5:
    Hacl_Hash_MD5_hash_oneshot(output,input,input_len);
    return;
  case 6:
    _Var10 = EverCrypt_AutoConfig2_has_vec128();
    if (_Var10) {
      Hacl_Hash_Blake2s_Simd128_hash_with_key(output,0x20,input,input_len,(uint8_t *)0x0,0);
      return;
    }
    Hacl_Hash_Blake2s_hash_with_key(output,0x20,input,input_len,(uint8_t *)0x0,0);
    return;
  case 7:
    _Var10 = EverCrypt_AutoConfig2_has_vec256();
    if (_Var10) {
      Hacl_Hash_Blake2b_Simd256_hash_with_key(output,0x40,input,input_len,(uint8_t *)0x0,0);
      return;
    }
    Hacl_Hash_Blake2b_hash_with_key(output,0x40,input,input_len,(uint8_t *)0x0,0);
    return;
  case 8:
    Hacl_Hash_SHA3_sha3_256(output,input,input_len);
    return;
  case 9:
    Hacl_Hash_SHA3_sha3_224(output,input,input_len);
    return;
  case 10:
    Hacl_Hash_SHA3_sha3_384(output,input,input_len);
    return;
  case 0xb:
    Hacl_Hash_SHA3_sha3_512(output,input,input_len);
    return;
  }
  EverCrypt_Hash_Incremental_hash_cold_1();
  bVar1 = (byte)(*palVar16)[0];
  uVar15 = (uint)bVar1;
  if (bVar1 < 0xe) {
    st = (Lib_IntVector_Intrinsics_vec256 *)(*palVar16)[1];
    switch(bVar1) {
    case 0:
      if ((char)(*(Lib_IntVector_Intrinsics_vec256 *)output)[0] != '\0') {
        uVar14 = 0x388;
        goto LAB_0017b31a;
      }
      puVar11 = (undefined4 *)(*(Lib_IntVector_Intrinsics_vec256 *)output)[1];
      break;
    case 1:
      if ((char)(*(Lib_IntVector_Intrinsics_vec256 *)output)[0] != '\x01') {
        uVar14 = 0x398;
        goto LAB_0017b31a;
      }
      puVar11 = (undefined4 *)(*(Lib_IntVector_Intrinsics_vec256 *)output)[1];
      puVar11[4] = (int)(*st)[2];
      break;
    case 2:
      if ((char)(*(Lib_IntVector_Intrinsics_vec256 *)output)[0] != '\x02') {
        uVar14 = 0x3a8;
        goto LAB_0017b31a;
      }
      goto LAB_0017b16a;
    case 3:
      if ((char)(*(Lib_IntVector_Intrinsics_vec256 *)output)[0] != '\x03') {
        uVar14 = 0x3b8;
        goto LAB_0017b31a;
      }
LAB_0017b16a:
      puVar11 = (undefined4 *)(*(Lib_IntVector_Intrinsics_vec256 *)output)[1];
      uVar18 = (undefined4)(*st)[0];
      uVar19 = *(undefined4 *)((long)*st + 4);
      uVar20 = (undefined4)(*st)[1];
      uVar21 = *(undefined4 *)((long)*st + 0xc);
      uVar22 = (undefined4)(*st)[2];
      uVar23 = *(undefined4 *)((long)*st + 0x14);
      uVar24 = (undefined4)(*st)[3];
      uVar25 = *(undefined4 *)((long)*st + 0x1c);
LAB_0017b1db:
      puVar11[4] = uVar22;
      puVar11[5] = uVar23;
      puVar11[6] = uVar24;
      puVar11[7] = uVar25;
      goto LAB_0017b1df;
    case 4:
      if ((char)(*(Lib_IntVector_Intrinsics_vec256 *)output)[0] != '\x04') {
        uVar14 = 0x3c8;
        goto LAB_0017b31a;
      }
      goto LAB_0017b1c0;
    case 5:
      if ((char)(*(Lib_IntVector_Intrinsics_vec256 *)output)[0] != '\x05') {
        uVar14 = 0x3d8;
        goto LAB_0017b31a;
      }
LAB_0017b1c0:
      puVar11 = (undefined4 *)(*(Lib_IntVector_Intrinsics_vec256 *)output)[1];
      uVar18 = (undefined4)(*st)[0];
      uVar19 = *(undefined4 *)((long)*st + 4);
      uVar20 = (undefined4)(*st)[1];
      uVar21 = *(undefined4 *)((long)*st + 0xc);
      uVar22 = (undefined4)(*st)[2];
      uVar23 = *(undefined4 *)((long)*st + 0x14);
      uVar24 = (undefined4)(*st)[3];
      uVar25 = *(undefined4 *)((long)*st + 0x1c);
      lVar3 = st[1][0];
      lVar4 = st[1][1];
      lVar5 = st[1][3];
      *(longlong *)(puVar11 + 0xc) = st[1][2];
      *(longlong *)(puVar11 + 0xe) = lVar5;
      *(longlong *)(puVar11 + 8) = lVar3;
      *(longlong *)(puVar11 + 10) = lVar4;
      goto LAB_0017b1db;
    case 6:
      if ((char)(*(Lib_IntVector_Intrinsics_vec256 *)output)[0] != '\x06') {
        uVar14 = 1000;
        goto LAB_0017b31a;
      }
      goto LAB_0017b269;
    case 7:
      if ((char)(*(Lib_IntVector_Intrinsics_vec256 *)output)[0] == '\a') goto LAB_0017b269;
      uVar14 = 0x3f8;
      goto LAB_0017b31a;
    case 8:
      if ((char)(*(Lib_IntVector_Intrinsics_vec256 *)output)[0] == '\b') goto LAB_0017b269;
      uVar14 = 0x408;
      goto LAB_0017b31a;
    case 9:
      goto switchD_0017b07f_caseD_9;
    case 10:
      bVar17 = (byte)(*(Lib_IntVector_Intrinsics_vec256 *)output)[0];
      uVar15 = (uint)bVar17;
      palVar16 = (Lib_IntVector_Intrinsics_vec256 *)(*(Lib_IntVector_Intrinsics_vec256 *)output)[1];
      if (bVar17 == 0xb) {
        Hacl_Hash_Blake2s_Simd128_load_state128s_from_state32
                  ((Lib_IntVector_Intrinsics_vec128 *)palVar16,(uint32_t *)st);
        return;
      }
      if (bVar17 == 10) {
        lVar3 = (*st)[0];
        lVar4 = (*st)[1];
        lVar5 = (*st)[2];
        lVar6 = (*st)[3];
        lVar7 = st[1][0];
        lVar8 = st[1][1];
        lVar9 = st[1][3];
        palVar16[1][2] = st[1][2];
        palVar16[1][3] = lVar9;
        palVar16[1][0] = lVar7;
        palVar16[1][1] = lVar8;
        (*palVar16)[2] = lVar5;
        (*palVar16)[3] = lVar6;
        (*palVar16)[0] = lVar3;
        (*palVar16)[1] = lVar4;
        return;
      }
      goto LAB_0017b33a;
    case 0xb:
      bVar17 = (byte)(*(Lib_IntVector_Intrinsics_vec256 *)output)[0];
      uVar15 = (uint)bVar17;
      palVar16 = (Lib_IntVector_Intrinsics_vec256 *)(*(Lib_IntVector_Intrinsics_vec256 *)output)[1];
      if (bVar17 == 10) {
        Hacl_Hash_Blake2s_Simd128_store_state128s_to_state32
                  ((uint32_t *)palVar16,(Lib_IntVector_Intrinsics_vec128 *)st);
        return;
      }
      if (bVar17 == 0xb) {
        lVar3 = (*st)[0];
        lVar4 = (*st)[1];
        lVar5 = (*st)[2];
        lVar6 = (*st)[3];
        lVar7 = st[1][0];
        lVar8 = st[1][1];
        lVar9 = st[1][3];
        palVar16[1][2] = st[1][2];
        palVar16[1][3] = lVar9;
        palVar16[1][0] = lVar7;
        palVar16[1][1] = lVar8;
        (*palVar16)[2] = lVar5;
        (*palVar16)[3] = lVar6;
        (*palVar16)[0] = lVar3;
        (*palVar16)[1] = lVar4;
        return;
      }
      goto LAB_0017b330;
    case 0xc:
      cVar2 = (char)(*(Lib_IntVector_Intrinsics_vec256 *)output)[0];
      palVar16 = (Lib_IntVector_Intrinsics_vec256 *)(*(Lib_IntVector_Intrinsics_vec256 *)output)[1];
      if (cVar2 == '\r') {
        Hacl_Hash_Blake2b_Simd256_load_state256b_from_state32(palVar16,(uint64_t *)st);
        return;
      }
      if (cVar2 == '\f') {
LAB_0017b1fd:
        for (lVar12 = 0x10; lVar12 != 0; lVar12 = lVar12 + -1) {
          (*palVar16)[0] = (*st)[0];
          st = (Lib_IntVector_Intrinsics_vec256 *)((long)st + ((ulong)bVar17 * -2 + 1) * 8);
          palVar16 = (Lib_IntVector_Intrinsics_vec256 *)
                     ((long)palVar16 + ((ulong)bVar17 * -2 + 1) * 8);
        }
        return;
      }
      copy_cold_3();
      output = (uint8_t *)extraout_RAX;
      goto switchD_0017b07f_caseD_9;
    case 0xd:
      bVar1 = (byte)(*(Lib_IntVector_Intrinsics_vec256 *)output)[0];
      uVar15 = (uint)bVar1;
      palVar16 = (Lib_IntVector_Intrinsics_vec256 *)(*(Lib_IntVector_Intrinsics_vec256 *)output)[1];
      if (bVar1 == 0xc) {
        Hacl_Hash_Blake2b_Simd256_store_state256b_to_state32((uint64_t *)palVar16,st);
        return;
      }
      if (bVar1 == 0xd) goto LAB_0017b1fd;
      goto LAB_0017b335;
    }
    uVar18 = (undefined4)(*st)[0];
    uVar19 = *(undefined4 *)((long)*st + 4);
    uVar20 = (undefined4)(*st)[1];
    uVar21 = *(undefined4 *)((long)*st + 0xc);
LAB_0017b1df:
    *puVar11 = uVar18;
    puVar11[1] = uVar19;
    puVar11[2] = uVar20;
    puVar11[3] = uVar21;
    return;
  }
  copy_cold_5();
  st = (Lib_IntVector_Intrinsics_vec256 *)output;
LAB_0017b330:
  copy_cold_2();
LAB_0017b335:
  copy_cold_1();
LAB_0017b33a:
  copy_cold_4();
  bVar17 = (byte)(*palVar16)[0];
  if (0xd < bVar17) {
    update_last_cold_1();
    bVar17 = (byte)(*palVar16)[0];
    if (0xd < bVar17) {
      finish_cold_1();
      return;
    }
    palVar16 = (Lib_IntVector_Intrinsics_vec256 *)(*palVar16)[1];
    switch(bVar17) {
    case 0:
      Hacl_Hash_MD5_finish((uint32_t *)palVar16,(uint8_t *)st);
      return;
    case 1:
      Hacl_Hash_SHA1_finish((uint32_t *)palVar16,(uint8_t *)st);
      return;
    case 2:
      Hacl_Hash_SHA2_sha224_finish((uint32_t *)palVar16,(uint8_t *)st);
      return;
    case 3:
      Hacl_Hash_SHA2_sha256_finish((uint32_t *)palVar16,(uint8_t *)st);
      return;
    case 4:
      Hacl_Hash_SHA2_sha384_finish((uint64_t *)palVar16,(uint8_t *)st);
      return;
    case 5:
      Hacl_Hash_SHA2_sha512_finish((uint64_t *)palVar16,(uint8_t *)st);
      return;
    case 6:
      uVar18 = (undefined4)(*palVar16)[0];
      uVar19 = *(undefined4 *)((long)*palVar16 + 4);
      uVar20 = (undefined4)(*palVar16)[1];
      uVar21 = *(undefined4 *)((long)*palVar16 + 0xc);
      lVar3 = (*palVar16)[2];
      *(int *)(*st + 3) = (int)(*palVar16)[3];
      (*st)[2] = lVar3;
      goto LAB_0017b5d0;
    case 7:
      uVar18 = (undefined4)(*palVar16)[0];
      uVar19 = *(undefined4 *)((long)*palVar16 + 4);
      uVar20 = (undefined4)(*palVar16)[1];
      uVar21 = *(undefined4 *)((long)*palVar16 + 0xc);
      uVar22 = (undefined4)(*palVar16)[2];
      uVar23 = *(undefined4 *)((long)*palVar16 + 0x14);
      uVar24 = (undefined4)(*palVar16)[3];
      uVar25 = *(undefined4 *)((long)*palVar16 + 0x1c);
      goto LAB_0017b5cc;
    case 8:
      uVar18 = (undefined4)(*palVar16)[0];
      uVar19 = *(undefined4 *)((long)*palVar16 + 4);
      uVar20 = (undefined4)(*palVar16)[1];
      uVar21 = *(undefined4 *)((long)*palVar16 + 0xc);
      uVar22 = (undefined4)(*palVar16)[2];
      uVar23 = *(undefined4 *)((long)*palVar16 + 0x14);
      uVar24 = (undefined4)(*palVar16)[3];
      uVar25 = *(undefined4 *)((long)*palVar16 + 0x1c);
      uVar26 = (undefined4)palVar16[1][0];
      uVar27 = *(undefined4 *)((long)palVar16[1] + 4);
      uVar28 = (undefined4)palVar16[1][1];
      uVar29 = *(undefined4 *)((long)palVar16[1] + 0xc);
      break;
    case 9:
      uVar18 = (undefined4)(*palVar16)[0];
      uVar19 = *(undefined4 *)((long)*palVar16 + 4);
      uVar20 = (undefined4)(*palVar16)[1];
      uVar21 = *(undefined4 *)((long)*palVar16 + 0xc);
      uVar22 = (undefined4)(*palVar16)[2];
      uVar23 = *(undefined4 *)((long)*palVar16 + 0x14);
      uVar24 = (undefined4)(*palVar16)[3];
      uVar25 = *(undefined4 *)((long)*palVar16 + 0x1c);
      uVar26 = (undefined4)palVar16[1][0];
      uVar27 = *(undefined4 *)((long)palVar16[1] + 4);
      uVar28 = (undefined4)palVar16[1][1];
      uVar29 = *(undefined4 *)((long)palVar16[1] + 0xc);
      lVar3 = palVar16[1][3];
      st[1][2] = palVar16[1][2];
      st[1][3] = lVar3;
      break;
    case 10:
      Hacl_Hash_Blake2s_finish(0x20,(uint8_t *)st,(uint32_t *)palVar16);
      return;
    case 0xb:
      Hacl_Hash_Blake2s_Simd128_finish
                (0x20,(uint8_t *)st,(Lib_IntVector_Intrinsics_vec128 *)palVar16);
      return;
    case 0xc:
      Hacl_Hash_Blake2b_finish(0x40,(uint8_t *)st,(uint64_t *)palVar16);
      return;
    case 0xd:
      Hacl_Hash_Blake2b_Simd256_finish(0x40,(uint8_t *)st,palVar16);
      return;
    }
    *(undefined4 *)st[1] = uVar26;
    *(undefined4 *)((long)st[1] + 4) = uVar27;
    *(undefined4 *)(st[1] + 1) = uVar28;
    *(undefined4 *)((long)st[1] + 0xc) = uVar29;
LAB_0017b5cc:
    *(undefined4 *)(*st + 2) = uVar22;
    *(undefined4 *)((long)*st + 0x14) = uVar23;
    *(undefined4 *)(*st + 3) = uVar24;
    *(undefined4 *)((long)*st + 0x1c) = uVar25;
LAB_0017b5d0:
    *(undefined4 *)*st = uVar18;
    *(undefined4 *)((long)*st + 4) = uVar19;
    *(undefined4 *)(*st + 1) = uVar20;
    *(undefined4 *)((long)*st + 0xc) = uVar21;
    return;
  }
  hash = (uint64_t *)(ulong)uVar15;
  palVar16 = (Lib_IntVector_Intrinsics_vec256 *)(*palVar16)[1];
  uVar13 = (uint32_t)st;
  switch(bVar17) {
  case 0:
    Hacl_Hash_MD5_update_last((uint32_t *)palVar16,(uint64_t)st,d,uVar15);
    break;
  case 1:
    Hacl_Hash_SHA1_update_last((uint32_t *)palVar16,(uint64_t)st,d,uVar15);
    break;
  case 2:
    Hacl_Hash_SHA2_sha224_update_last((long)hash + (long)st,uVar15,d,(uint32_t *)palVar16);
    break;
  case 3:
    Hacl_Hash_SHA2_sha256_update_last((long)hash + (long)st,uVar15,d,(uint32_t *)palVar16);
    break;
  case 4:
    totlen._8_8_ = in_stack_fffffffffffffec8;
    totlen._0_8_ = in_stack_fffffffffffffec0;
    Hacl_Hash_SHA2_sha384_update_last
              ((FStar_UInt128_uint128)totlen,uVar15 + uVar13,
               (uint8_t *)(ulong)CARRY8((ulong)hash,(ulong)st),hash);
    break;
  case 5:
    totlen_00._8_8_ = in_stack_fffffffffffffec8;
    totlen_00._0_8_ = in_stack_fffffffffffffec0;
    Hacl_Hash_SHA2_sha512_update_last
              ((FStar_UInt128_uint128)totlen_00,uVar15 + uVar13,
               (uint8_t *)(ulong)CARRY8((ulong)hash,(ulong)st),hash);
    break;
  case 6:
    a_00 = '\t';
    goto LAB_0017b4fb;
  case 7:
    a_00 = '\b';
    goto LAB_0017b4fb;
  case 8:
    a_00 = '\n';
    goto LAB_0017b4fb;
  case 9:
    a_00 = '\v';
LAB_0017b4fb:
    Hacl_Hash_SHA3_update_last_sha3(a_00,(uint64_t *)palVar16,d,uVar15);
    break;
  case 10:
    auStack_120[6] = 0;
    auStack_120[7] = 0;
    auStack_120[4] = 0;
    auStack_120[5] = 0;
    auStack_120[2] = 0;
    auStack_120[3] = 0;
    auStack_120[0] = 0;
    auStack_120[1] = 0;
    Hacl_Hash_Blake2s_update_last
              (uVar15,(uint32_t *)auStack_120,(uint32_t *)palVar16,(uint64_t)st,uVar15,d);
    break;
  case 0xb:
    auStack_120[6] = 0;
    auStack_120[7] = 0;
    auStack_120[4] = 0;
    auStack_120[5] = 0;
    auStack_120[2] = 0;
    auStack_120[3] = 0;
    auStack_120[0] = 0;
    auStack_120[1] = 0;
    Hacl_Hash_Blake2s_Simd128_update_last
              (uVar15,(Lib_IntVector_Intrinsics_vec128 *)auStack_120,
               (Lib_IntVector_Intrinsics_vec128 *)palVar16,(uint64_t)st,uVar15,d);
    break;
  case 0xc:
    auStack_120[0xe] = 0;
    auStack_120[0xf] = 0;
    auStack_120[0xc] = 0;
    auStack_120[0xd] = 0;
    auStack_120[10] = 0;
    auStack_120[0xb] = 0;
    auStack_120[8] = 0;
    auStack_120[9] = 0;
    auStack_120[6] = 0;
    auStack_120[7] = 0;
    auStack_120[4] = 0;
    auStack_120[5] = 0;
    auStack_120[2] = 0;
    auStack_120[3] = 0;
    auStack_120[0] = 0;
    auStack_120[1] = 0;
    prev._8_8_ = in_stack_fffffffffffffec8;
    prev._0_8_ = d;
    Hacl_Hash_Blake2b_update_last
              (uVar15,auStack_120,(uint64_t *)palVar16,(FStar_UInt128_uint128)prev,uVar13,
               (uint8_t *)0x0);
    break;
  case 0xd:
    auStack_120[0xe] = 0;
    auStack_120[0xf] = 0;
    auStack_120[0xc] = 0;
    auStack_120[0xd] = 0;
    auStack_120[10] = 0;
    auStack_120[0xb] = 0;
    auStack_120[8] = 0;
    auStack_120[9] = 0;
    auStack_120[6] = 0;
    auStack_120[7] = 0;
    auStack_120[4] = 0;
    auStack_120[5] = 0;
    auStack_120[2] = 0;
    auStack_120[3] = 0;
    auStack_120[0] = 0;
    auStack_120[1] = 0;
    prev_00._8_8_ = in_stack_fffffffffffffec8;
    prev_00._0_8_ = d;
    Hacl_Hash_Blake2b_Simd256_update_last
              (uVar15,(Lib_IntVector_Intrinsics_vec256 *)auStack_120,palVar16,
               (FStar_UInt128_uint128)prev_00,uVar13,(uint8_t *)0x0);
  }
  return;
switchD_0017b07f_caseD_9:
  if ((char)(*(Lib_IntVector_Intrinsics_vec256 *)output)[0] == '\t') {
LAB_0017b269:
    memcpy((void *)(*(Lib_IntVector_Intrinsics_vec256 *)output)[1],st,200);
    return;
  }
  uVar14 = 0x418;
LAB_0017b31a:
  printf("KaRaMeL abort at %s:%d\n%s\n",
         "/workspace/llm4binary/github/license_c_cmakelists/cryspen[P]hacl-packages/src/EverCrypt_Hash.c"
         ,uVar14,"unreachable (pattern matches are exhaustive in F*)");
  exit(0xff);
}

Assistant:

void
EverCrypt_Hash_Incremental_hash(
  Spec_Hash_Definitions_hash_alg a,
  uint8_t *output,
  uint8_t *input,
  uint32_t input_len
)
{
  switch (a)
  {
    case Spec_Hash_Definitions_MD5:
      {
        Hacl_Hash_MD5_hash_oneshot(output, input, input_len);
        break;
      }
    case Spec_Hash_Definitions_SHA1:
      {
        Hacl_Hash_SHA1_hash_oneshot(output, input, input_len);
        break;
      }
    case Spec_Hash_Definitions_SHA2_224:
      {
        hash_224(output, input, input_len);
        break;
      }
    case Spec_Hash_Definitions_SHA2_256:
      {
        EverCrypt_Hash_Incremental_hash_256(output, input, input_len);
        break;
      }
    case Spec_Hash_Definitions_SHA2_384:
      {
        Hacl_Hash_SHA2_hash_384(output, input, input_len);
        break;
      }
    case Spec_Hash_Definitions_SHA2_512:
      {
        Hacl_Hash_SHA2_hash_512(output, input, input_len);
        break;
      }
    case Spec_Hash_Definitions_SHA3_224:
      {
        Hacl_Hash_SHA3_sha3_224(output, input, input_len);
        break;
      }
    case Spec_Hash_Definitions_SHA3_256:
      {
        Hacl_Hash_SHA3_sha3_256(output, input, input_len);
        break;
      }
    case Spec_Hash_Definitions_SHA3_384:
      {
        Hacl_Hash_SHA3_sha3_384(output, input, input_len);
        break;
      }
    case Spec_Hash_Definitions_SHA3_512:
      {
        Hacl_Hash_SHA3_sha3_512(output, input, input_len);
        break;
      }
    case Spec_Hash_Definitions_Blake2S:
      {
        #if HACL_CAN_COMPILE_VEC128
        bool vec128 = EverCrypt_AutoConfig2_has_vec128();
        if (vec128)
        {
          Hacl_Hash_Blake2s_Simd128_hash_with_key(output, 32U, input, input_len, NULL, 0U);
          return;
        }
        Hacl_Hash_Blake2s_hash_with_key(output, 32U, input, input_len, NULL, 0U);
        #else
        Hacl_Hash_Blake2s_hash_with_key(output, 32U, input, input_len, NULL, 0U);
        #endif
        break;
      }
    case Spec_Hash_Definitions_Blake2B:
      {
        #if HACL_CAN_COMPILE_VEC256
        bool vec256 = EverCrypt_AutoConfig2_has_vec256();
        if (vec256)
        {
          Hacl_Hash_Blake2b_Simd256_hash_with_key(output, 64U, input, input_len, NULL, 0U);
          return;
        }
        Hacl_Hash_Blake2b_hash_with_key(output, 64U, input, input_len, NULL, 0U);
        #else
        Hacl_Hash_Blake2b_hash_with_key(output, 64U, input, input_len, NULL, 0U);
        #endif
        break;
      }
    default:
      {
        KRML_HOST_EPRINTF("KaRaMeL incomplete match at %s:%d\n", __FILE__, __LINE__);
        KRML_HOST_EXIT(253U);
      }
  }
}